

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

SearchResult __thiscall
gss::innards::HomomorphismSearcher::restarting_search
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments,Domains *domains,
          unsigned_long_long *nodes,unsigned_long_long *propagations,loooong *solution_count,
          int depth,RestartsSchedule *restarts_schedule)

{
  pointer *ppHVar1;
  PropagateUsingLackey PVar2;
  Proof *pPVar3;
  pointer pHVar4;
  pointer ppVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  SearchResult SVar10;
  int iVar11;
  HomomorphismDomain *pHVar12;
  undefined7 extraout_var;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  HomomorphismSearcher *pHVar13;
  pointer pHVar14;
  uint *puVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  uint *local_1b8;
  undefined1 local_198 [8];
  string asStack_190 [8];
  undefined1 auStack_188 [28];
  int local_16c;
  vector<int,_std::allocator<int>_> branch_v;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  proof_domains;
  Domains new_domains;
  SVOBitset remaining;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((pPVar3 != (Proof *)0x0) && (bVar6 = Proof::super_extra_verbose(pPVar3), bVar6)) {
    proof_domains.
    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    proof_domains.
    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    proof_domains.
    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pHVar4 = (domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pHVar14 = (domains->
                   super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   )._M_impl.super__Vector_impl_data._M_start; pHVar14 != pHVar4;
        pHVar14 = pHVar14 + 1) {
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_198,this->model,pHVar14->v);
      branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      std::
      pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::
      pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                ((pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&remaining,(NamedVertex *)local_198,
                 (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&branch_v);
      std::
      vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
      ::
      emplace_back<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>
                ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                  *)&proof_domains,
                 (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&remaining);
      std::
      pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~pair((pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&remaining);
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&branch_v);
      std::__cxx11::string::~string(asStack_190);
      SVOBitset::SVOBitset(&remaining,&pHVar14->values);
      while (uVar8 = SVOBitset::find_first(&remaining), uVar8 != 0xffffffff) {
        SVOBitset::reset(&remaining,uVar8);
        ppVar5 = proof_domains.
                 super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)local_198,this->model,uVar8);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)&ppVar5[-1].second,(NamedVertex *)local_198);
        std::__cxx11::string::~string(asStack_190);
      }
      SVOBitset::~SVOBitset(&remaining);
    }
    pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__cxx11::to_string((string *)local_198,depth);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&remaining,
                   "entering depth ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    Proof::show_domains(pPVar3,(string *)&remaining,&proof_domains);
    std::__cxx11::string::~string((string *)&remaining);
    std::__cxx11::string::~string((string *)local_198);
    std::
    vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~vector(&proof_domains);
  }
  bVar6 = Timeout::should_abort
                    ((this->params->timeout).
                     super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar6) {
    return Aborted;
  }
  *nodes = *nodes + 1;
  pHVar13 = this;
  pHVar12 = find_branch_domain(this,domains);
  if (pHVar12 == (HomomorphismDomain *)0x0) {
    if ((this->params->lackey)._M_t.
        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t
        .super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
        super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0)
    goto LAB_0012fd46;
    remaining._data.short_data[3] = (BitWord)(&remaining._data.long_data + 1);
    remaining._data.short_data[1]._0_4_ = 0;
    remaining._data.short_data[2] = 0;
    remaining._data.short_data[5] = 0;
    remaining._data.short_data[4] = remaining._data.short_data[3];
    expand_to_full_result(pHVar13,assignments,(VertexToVertexMapping *)&remaining);
    local_198 = (undefined1  [8])0x0;
    asStack_190[0] = (string)0x0;
    asStack_190[1] = (string)0x0;
    asStack_190[2] = (string)0x0;
    asStack_190[3] = (string)0x0;
    asStack_190[4] = (string)0x0;
    asStack_190[5] = (string)0x0;
    asStack_190[6] = (string)0x0;
    asStack_190[7] = (string)0x0;
    auStack_188._0_4_ = 0;
    auStack_188._4_4_ = 0;
    auStack_188._8_8_ = 0;
    bVar6 = Lackey::check_solution
                      ((this->params->lackey)._M_t.
                       super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                       .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl,
                       (VertexToVertexMapping *)&remaining,false,this->params->count_solutions,
                       (function<bool_(int,_int)> *)local_198);
    SVar10 = (SearchResult)CONCAT71(extraout_var,bVar6);
    std::_Function_base::~_Function_base((_Function_base *)local_198);
    if (bVar6) {
LAB_0012f84b:
      bVar6 = true;
    }
    else {
      bVar6 = false;
      PVar2 = this->params->propagate_using_lackey;
      if (PVar2 < RootAndBackjump) {
        SVar10 = Unsatisfiable;
        bVar6 = false;
      }
      else {
        if (PVar2 != RootAndBackjump) goto LAB_0012f84b;
        SVar10 = UnsatisfiableAndBackjumpUsingLackey;
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)&remaining);
    if (!bVar6) {
      return SVar10;
    }
LAB_0012fd46:
    pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar3 != (Proof *)0x0) {
      solution_in_proof_form_abi_cxx11_
                ((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&remaining,this,assignments);
      Proof::post_solution
                (pPVar3,(vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&remaining);
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&remaining);
    }
    if (this->params->count_solutions != true) {
      return Satisfiable;
    }
    bVar6 = std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::operator()
                      (&this->_duplicate_solution_filterer,assignments);
    if ((bVar6) &&
       (boost::multiprecision::backends::
        eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  (&solution_count->m_backend),
       (this->params->enumerate_callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
      remaining._data.short_data[3] = (BitWord)(&remaining._data.long_data + 1);
      remaining._data.short_data[1]._0_4_ = 0;
      remaining._data.short_data[2] = 0;
      remaining._data.short_data[5] = 0;
      remaining._data.short_data[4] = remaining._data.short_data[3];
      expand_to_full_result
                ((HomomorphismSearcher *)solution_count,assignments,
                 (VertexToVertexMapping *)&remaining);
      bVar6 = std::
              function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
              ::operator()(&this->params->enumerate_callback,
                           (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&remaining);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&remaining);
      if (!bVar6) {
        return Satisfiable;
      }
    }
    return SatisfiableButKeepGoing;
  }
  SVOBitset::SVOBitset(&remaining,&pHVar12->values);
  __last._M_current = (int *)(ulong)this->model->target_size;
  std::vector<int,_std::allocator<int>_>::vector
            (&branch_v,(size_type)__last._M_current,(allocator_type *)local_198);
  uVar8 = 0;
  while( true ) {
    uVar9 = SVOBitset::find_first(&remaining);
    uVar16 = (ulong)uVar8;
    if (uVar9 == 0xffffffff) break;
    __last._M_current = (int *)(ulong)uVar9;
    SVOBitset::reset(&remaining,uVar9);
    uVar8 = uVar8 + 1;
    branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar16] = uVar9;
  }
  switch(this->params->value_ordering_heuristic) {
  case Biased:
    __last._M_current = (int *)&branch_v;
    softmax_shuffle(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar8);
    break;
  case Degree:
    bVar6 = false;
    goto LAB_0012f86d;
  case AntiDegree:
    bVar6 = true;
LAB_0012f86d:
    __last._M_current = (int *)&branch_v;
    degree_sort(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar8,bVar6);
    break;
  case Random:
    __last._M_current =
         branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + uVar16;
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,__last,&this->global_rand);
  }
  local_16c = 0;
  bVar7 = false;
  bVar6 = false;
  local_1b8 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  iVar11 = depth + 2;
  uVar9 = depth + 1;
  for (lVar17 = uVar16 << 2;
      pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, lVar17 != 0; lVar17 = lVar17 + -4) {
    if (pPVar3 != (Proof *)0x0) {
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_198,this->model,pHVar12->v);
      HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)&proof_domains,this->model,*local_1b8);
      Proof::guessing(pPVar3,depth,(NamedVertex *)local_198,(NamedVertex *)&proof_domains);
      std::__cxx11::string::~string
                ((string *)
                 &proof_domains.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string(asStack_190);
    }
    __last._M_current =
         (int *)(((long)(assignments->values).
                        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(assignments->values).
                       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x14);
    local_198._4_4_ = *local_1b8;
    local_198._0_4_ = pHVar12->v;
    asStack_190[0] = (string)0x1;
    asStack_190[4] = (string)(undefined1)local_16c;
    asStack_190[5] = (string)local_16c._1_1_;
    asStack_190[6] = (string)local_16c._2_1_;
    asStack_190[7] = (string)local_16c._3_1_;
    pHVar13 = (HomomorphismSearcher *)local_198;
    auStack_188._0_4_ = uVar8;
    std::
    vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ::emplace_back<gss::innards::HomomorphismAssignmentInformation>
              (&assignments->values,(HomomorphismAssignmentInformation *)local_198);
    copy_nonfixed_domains_and_make_assignment(&new_domains,pHVar13,domains,pHVar12->v,*local_1b8);
    *propagations = *propagations + 1;
    bVar18 = true;
    if (!bVar6) {
      bVar18 = this->params->propagate_using_lackey == Always;
    }
    pHVar13 = (HomomorphismSearcher *)0x0;
    bVar18 = propagate(this,false,&new_domains,assignments,bVar18);
    pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (bVar18) {
      if (pPVar3 != (Proof *)0x0) {
        Proof::start_level(pPVar3,iVar11);
      }
      pHVar13 = (HomomorphismSearcher *)assignments;
      SVar10 = restarting_search(this,assignments,&new_domains,nodes,propagations,solution_count,
                                 uVar9,restarts_schedule);
      switch(SVar10) {
      case Aborted:
      case Satisfiable:
        goto switchD_0012fa5e_caseD_0;
      case UnsatisfiableAndBackjumpUsingLackey:
        bVar6 = true;
      case Unsatisfiable:
        pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar3 != (Proof *)0x0) {
          pHVar13 = (HomomorphismSearcher *)(ulong)uVar9;
          Proof::back_up_to_level(pPVar3,uVar9);
          pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          assignments_as_proof_decisions
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_198
                     ,pHVar13,assignments);
          Proof::incorrect_guess
                    (pPVar3,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            local_198,true);
          std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_198);
          Proof::forget_level((this->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar11);
        }
        bVar7 = true;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)__last._M_current);
        pHVar13 = (HomomorphismSearcher *)__last._M_current;
        break;
      case SatisfiableButKeepGoing:
        pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar3 != (Proof *)0x0) {
          pHVar13 = (HomomorphismSearcher *)(ulong)uVar9;
          Proof::back_up_to_level(pPVar3,uVar9);
          pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          assignments_as_proof_decisions
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_198
                     ,pHVar13,assignments);
          Proof::incorrect_guess
                    (pPVar3,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            local_198,false);
          std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_198);
          Proof::forget_level((this->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar11);
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)__last._M_current);
        pHVar13 = (HomomorphismSearcher *)__last._M_current;
        break;
      case Restart:
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)__last._M_current);
        SVar10 = Restart;
        for (puVar15 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start; local_1b8 != puVar15;
            puVar15 = puVar15 + 1) {
          local_198._4_4_ = *puVar15;
          local_198._0_4_ = pHVar12->v;
          asStack_190[0] = (string)0x1;
          asStack_190[4] = (string)0xfe;
          asStack_190[5] = (string)0xff;
          asStack_190[6] = (string)0xff;
          asStack_190[7] = (string)0xff;
          auStack_188._0_4_ = 0xfffffffe;
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::emplace_back<gss::innards::HomomorphismAssignmentInformation>
                    (&assignments->values,(HomomorphismAssignmentInformation *)local_198);
          post_nogood(this,assignments);
          ppHVar1 = &(assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppHVar1 = *ppHVar1 + -1;
        }
        goto switchD_0012fa5e_caseD_0;
      }
      local_16c = local_16c + 1;
      __last._M_current = (int *)pHVar13;
    }
    else {
      if (pPVar3 != (Proof *)0x0) {
        assignments_as_proof_decisions
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,
                   pHVar13,assignments);
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)local_198,this->model,pHVar12->v);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&proof_domains,this->model,*local_1b8);
        Proof::propagation_failure
                  (pPVar3,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_48,(NamedVertex *)local_198,(NamedVertex *)&proof_domains);
        std::__cxx11::string::~string
                  ((string *)
                   &proof_domains.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string(asStack_190);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&local_48);
      }
      bVar7 = true;
      std::
      vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ::resize(&assignments->values,(size_type)__last._M_current);
    }
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::~vector(&new_domains);
    local_1b8 = local_1b8 + 1;
  }
  if (pPVar3 != (Proof *)0x0) {
    assignments_as_proof_decisions
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_198,
               (HomomorphismSearcher *)__last._M_current,assignments);
    Proof::out_of_guesses
              (pPVar3,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      local_198);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_198
              );
  }
  if (bVar7) {
    (*restarts_schedule->_vptr_RestartsSchedule[2])();
  }
  iVar11 = (*restarts_schedule->_vptr_RestartsSchedule[4])();
  if ((char)iVar11 == '\0') {
    SVar10 = bVar6 + Unsatisfiable;
  }
  else {
    pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar3 != (Proof *)0x0) {
      Proof::back_up_to_top(pPVar3);
    }
    post_nogood(this,assignments);
    SVar10 = Restart;
  }
LAB_0012fd00:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&branch_v.super__Vector_base<int,_std::allocator<int>_>);
  SVOBitset::~SVOBitset(&remaining);
  return SVar10;
switchD_0012fa5e_caseD_0:
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  ~vector(&new_domains);
  goto LAB_0012fd00;
}

Assistant:

auto HomomorphismSearcher::restarting_search(
    HomomorphismAssignments & assignments,
    const Domains & domains,
    unsigned long long & nodes,
    unsigned long long & propagations,
    loooong & solution_count,
    int depth,
    RestartsSchedule & restarts_schedule) -> SearchResult
{
    if (proof && proof->super_extra_verbose()) {
        vector<pair<NamedVertex, vector<NamedVertex>>> proof_domains;
        for (auto & d : domains) {
            proof_domains.push_back(pair{model.pattern_vertex_for_proof(d.v), vector<NamedVertex>{}});
            auto values = d.values;
            for (auto v = values.find_first(); v != decltype(values)::npos; v = values.find_first()) {
                values.reset(v);
                proof_domains.back().second.push_back(model.target_vertex_for_proof(v));
            }
        }
        proof->show_domains("entering depth " + to_string(depth), proof_domains);
    }

    if (params.timeout->should_abort())
        return SearchResult::Aborted;

    ++nodes;

    // find ourselves a domain, or succeed if we're all assigned
    const HomomorphismDomain * branch_domain = find_branch_domain(domains);
    if (! branch_domain) {
        if (params.lackey) {
            VertexToVertexMapping mapping;
            expand_to_full_result(assignments, mapping);
            if (! params.lackey->check_solution(mapping, false, params.count_solutions, {})) {
                switch (params.propagate_using_lackey) {
                case PropagateUsingLackey::RootAndBackjump:
                    return SearchResult::UnsatisfiableAndBackjumpUsingLackey;
                case PropagateUsingLackey::Never:
                case PropagateUsingLackey::Root:
                case PropagateUsingLackey::Always:
                    return SearchResult::Unsatisfiable;
                }
            }
        }

        if (proof)
            proof->post_solution(solution_in_proof_form(assignments));

        if (params.count_solutions) {
            // we could be finding duplicate solutions, in threaded search
            if (_duplicate_solution_filterer(assignments)) {
                ++solution_count;
                if (params.enumerate_callback) {
                    VertexToVertexMapping mapping;
                    expand_to_full_result(assignments, mapping);
                    if (! params.enumerate_callback(mapping))
                        return SearchResult::Satisfiable;
                }
            }

            return SearchResult::SatisfiableButKeepGoing;
        }
        else
            return SearchResult::Satisfiable;
    }

    // pull out the remaining values in this domain for branching
    auto remaining = branch_domain->values;

    vector<int> branch_v(model.target_size);

    unsigned branch_v_end = 0;
    for (auto f_v = remaining.find_first(); f_v != decltype(remaining)::npos; f_v = remaining.find_first()) {
        remaining.reset(f_v);
        branch_v[branch_v_end++] = f_v;
    }

    switch (params.value_ordering_heuristic) {
    case ValueOrdering::None:
        break;

    case ValueOrdering::Degree:
        degree_sort(branch_v, branch_v_end, false);
        break;

    case ValueOrdering::AntiDegree:
        degree_sort(branch_v, branch_v_end, true);
        break;

    case ValueOrdering::Biased:
        softmax_shuffle(branch_v, branch_v_end);
        break;

    case ValueOrdering::Random:
        shuffle(branch_v.begin(), branch_v.begin() + branch_v_end, global_rand);
        break;
    }

    int discrepancy_count = 0;
    bool actually_hit_a_failure = false;

    // override whether we use the lackey for propagation, in case we are inside a backjump
    bool use_lackey_for_propagation = false;

    // for each value remaining...
    for (auto f_v = branch_v.begin(), f_end = branch_v.begin() + branch_v_end; f_v != f_end; ++f_v) {
        if (proof)
            proof->guessing(depth, model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

        // modified in-place by appending, we can restore by shrinking
        auto assignments_size = assignments.values.size();

        // make the assignment
        assignments.values.push_back({{branch_domain->v, unsigned(*f_v)}, true, discrepancy_count, int(branch_v_end)});

        // set up new domains
        Domains new_domains = copy_nonfixed_domains_and_make_assignment(domains, branch_domain->v, *f_v);

        // propagate
        ++propagations;
        if (! propagate(false, new_domains, assignments, use_lackey_for_propagation || (params.propagate_using_lackey == PropagateUsingLackey::Always))) {
            // failure? restore assignments and go on to the next thing
            if (proof)
                proof->propagation_failure(assignments_as_proof_decisions(assignments), model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;

            continue;
        }

        if (proof)
            proof->start_level(depth + 2);

        // recursive search
        auto search_result = restarting_search(assignments, new_domains, nodes, propagations,
            solution_count, depth + 1, restarts_schedule);

        switch (search_result) {
        case SearchResult::Satisfiable:
            return SearchResult::Satisfiable;

        case SearchResult::Aborted:
            return SearchResult::Aborted;

        case SearchResult::Restart:
            // restore assignments before posting nogoods, it's easier
            assignments.values.resize(assignments_size);

            // post nogoods for everything we've done so far
            for (auto l = branch_v.begin(); l != f_v; ++l) {
                assignments.values.push_back({{branch_domain->v, unsigned(*l)}, true, -2, -2});
                post_nogood(assignments);
                assignments.values.pop_back();
            }

            return SearchResult::Restart;

        case SearchResult::SatisfiableButKeepGoing:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), false);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            break;

        case SearchResult::UnsatisfiableAndBackjumpUsingLackey:
            use_lackey_for_propagation = true;
            [[std::fallthrough]];

        case SearchResult::Unsatisfiable:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), true);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;
            break;
        }

        ++discrepancy_count;
    }

    // no values remaining, backtrack, or possibly kick off a restart
    if (proof)
        proof->out_of_guesses(assignments_as_proof_decisions(assignments));

    if (actually_hit_a_failure)
        restarts_schedule.did_a_backtrack();

    if (restarts_schedule.should_restart()) {
        if (proof)
            proof->back_up_to_top();
        post_nogood(assignments);
        return SearchResult::Restart;
    }
    else
        return use_lackey_for_propagation ? SearchResult::UnsatisfiableAndBackjumpUsingLackey : SearchResult::Unsatisfiable;
}